

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__readval(stbi__context *s,int channel,stbi_uc *dest)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  int i;
  long lVar5;
  int mask;
  uint uVar6;
  long in_FS_OFFSET;
  
  uVar6 = 0x80;
  lVar5 = 0;
  do {
    if ((uVar6 & channel) != 0) {
      if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001ded2e:
        psVar3 = s->img_buffer;
        psVar4 = s->img_buffer_end;
        if (psVar4 <= psVar3) {
LAB_001ded8f:
          *(char **)(in_FS_OFFSET + -0x68) = "PIC file too short";
          return (stbi_uc *)0x0;
        }
      }
      else {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 != 0) {
          if (s->read_from_callbacks == 0) goto LAB_001ded8f;
          goto LAB_001ded2e;
        }
        psVar3 = s->img_buffer;
        psVar4 = s->img_buffer_end;
      }
      if (psVar3 < psVar4) {
LAB_001ded6c:
        s->img_buffer = psVar3 + 1;
        sVar1 = *psVar3;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar3 = s->img_buffer;
          goto LAB_001ded6c;
        }
        sVar1 = '\0';
      }
      dest[lVar5] = sVar1;
    }
    lVar5 = lVar5 + 1;
    uVar6 = uVar6 >> 1;
    if (lVar5 == 4) {
      return dest;
    }
  } while( true );
}

Assistant:

static stbi_uc *stbi__readval(stbi__context *s, int channel, stbi_uc *dest)
{
   int mask=0x80, i;

   for (i=0; i<4; ++i, mask>>=1) {
      if (channel & mask) {
         if (stbi__at_eof(s)) return stbi__errpuc("bad file","PIC file too short");
         dest[i]=stbi__get8(s);
      }
   }

   return dest;
}